

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_tst_rolemaskproxymodel.cpp
# Opt level: O1

int __thiscall
tst_RoleMaskProxyModel::qt_metacall(tst_RoleMaskProxyModel *this,Call _c,int _id,void **_a)

{
  int _id_00;
  void **_a_00;
  undefined4 in_register_00000014;
  
  _a_00 = _a;
  _id_00 = QObject::qt_metacall((Call)this,_c,(void **)CONCAT44(in_register_00000014,_id));
  if (-1 < _id_00) {
    if (_c == RegisterMethodArgumentMetaType) {
      if (_id_00 < 0x27) {
        *(undefined8 *)*_a = 0;
      }
    }
    else {
      if (_c != InvokeMetaMethod) {
        return _id_00;
      }
      if (_id_00 < 0x27) {
        qt_static_metacall(&this->super_QObject,InvokeMetaMethod,_id_00,_a_00);
      }
    }
    _id_00 = _id_00 + -0x27;
  }
  return _id_00;
}

Assistant:

int tst_RoleMaskProxyModel::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QObject::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 39)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 39;
    } else if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 39)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 39;
    }
    return _id;
}